

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

void __thiscall Memory::Recycler::RootRelease(Recycler *this,void *obj,uint *count)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  uint uVar4;
  undefined4 *puVar5;
  PinRecord *pPVar6;
  ConfigFlagsTable *pCVar7;
  PinRecord *this_00;
  StackBackTrace *stackBackTrace;
  uint local_44;
  uint newRefCount;
  PinRecord *refCount_1;
  PinRecord *refCount;
  uint *count_local;
  void *obj_local;
  Recycler *this_local;
  
  BVar3 = IsValidObject(this,obj,0);
  if (BVar3 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x269,"(this->IsValidObject(obj))","this->IsValidObject(obj)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (this->transientPinnedObject == obj) {
    this->transientPinnedObject = (void *)0x0;
    if (count != (uint *)0x0) {
      pPVar6 = SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
               ::TryGetReference(&this->pinnedObjectMap,obj);
      if (pPVar6 == (PinRecord *)0x0) {
        local_44 = 0;
      }
      else {
        local_44 = PinRecord::operator_cast_to_unsigned_int(pPVar6);
      }
      *count = local_44;
    }
    pCVar7 = GetRecyclerFlagsTable(this);
    if ((pCVar7->LeakStackTrace & 1U) != 0) {
      StackBackTrace::Delete<Memory::NoCheckHeapAllocator>
                (this->transientPinnedObjectStackBackTrace,
                 (NoCheckHeapAllocator *)&NoCheckHeapAllocator::Instance);
    }
  }
  else {
    pPVar6 = SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
             ::TryGetReference(&this->pinnedObjectMap,obj);
    if (pPVar6 == (PinRecord *)0x0) {
      if (count != (uint *)0x0) {
        *count = 0xffffffff;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x288,"(false)","false");
      if (bVar2) {
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
        return;
      }
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    this_00 = PinRecord::operator--(pPVar6);
    uVar4 = PinRecord::operator_cast_to_unsigned_int(this_00);
    if (count != (uint *)0x0) {
      *count = uVar4;
    }
    if (uVar4 != 0) {
      pCVar7 = GetRecyclerFlagsTable(this);
      if ((pCVar7->LeakStackTrace & 1U) == 0) {
        return;
      }
      stackBackTrace =
           StackBackTrace::Capture<Memory::NoCheckHeapAllocator>
                     ((NoCheckHeapAllocator *)&NoCheckHeapAllocator::Instance,0,0x1e);
      StackBackTraceNode::Prepend<Memory::NoCheckHeapAllocator>
                ((NoCheckHeapAllocator *)&NoCheckHeapAllocator::Instance,&pPVar6->stackBackTraces,
                 stackBackTrace);
      return;
    }
    StackBackTraceNode::DeleteAll<Memory::NoCheckHeapAllocator>
              ((NoCheckHeapAllocator *)&NoCheckHeapAllocator::Instance,&pPVar6->stackBackTraces);
    pPVar6->stackBackTraces = (StackBackTraceNode *)0x0;
    if ((this->hasPendingConcurrentFindRoot & 1U) == 0) {
      SimpleHashTable<void_*,_Memory::Recycler::PinRecord,_Memory::HeapAllocator,_DefaultComparer,_true,_PrimePolicy>
      ::Remove(&this->pinnedObjectMap,obj);
    }
    else {
      this->hasPendingUnpinnedObject = true;
    }
  }
  CollectNow<(Memory::CollectionFlags)8320>(this);
  return;
}

Assistant:

void
Recycler::RootRelease(void* obj, uint *count)
{
    Assert(this->IsValidObject(obj));

    if (transientPinnedObject == obj)
    {
        transientPinnedObject = nullptr;

        if (count != nullptr)
        {
            PinRecord *refCount = pinnedObjectMap.TryGetReference(obj);
            *count = (refCount != nullptr) ? *refCount : 0;
        }

#if defined(CHECK_MEMORY_LEAK) || defined(LEAK_REPORT)
#ifdef STACK_BACK_TRACE
        if (GetRecyclerFlagsTable().LeakStackTrace)
        {
            transientPinnedObjectStackBackTrace->Delete(&NoCheckHeapAllocator::Instance);
        }
#endif
#endif
    }
    else
    {
        PinRecord *refCount = pinnedObjectMap.TryGetReference(obj);
        if (refCount == nullptr)
        {
            if (count != nullptr)
            {
                *count = (uint)-1;
            }
            // REVIEW: throw if not found
            Assert(false);
            return;
        }

        uint newRefCount = (--(*refCount));

        if (count != nullptr)
        {
            *count = newRefCount;
        }

        if (newRefCount != 0)
        {
#if defined(CHECK_MEMORY_LEAK) || defined(LEAK_REPORT)
#ifdef STACK_BACK_TRACE
            if (GetRecyclerFlagsTable().LeakStackTrace)
            {
                StackBackTraceNode::Prepend(&NoCheckHeapAllocator::Instance, refCount->stackBackTraces,
                    StackBackTrace::Capture(&NoCheckHeapAllocator::Instance));
            }
#endif
#endif
            return;
        }
#if defined(CHECK_MEMORY_LEAK) || defined(LEAK_REPORT)
#ifdef STACK_BACK_TRACE
        StackBackTraceNode::DeleteAll(&NoCheckHeapAllocator::Instance, refCount->stackBackTraces);
        refCount->stackBackTraces = nullptr;
#endif
#endif
#if ENABLE_CONCURRENT_GC
        // Don't delete the entry if we are in concurrent find root state
        // We will delete it later on in-thread find root
        if (this->hasPendingConcurrentFindRoot)
        {
            this->hasPendingUnpinnedObject = true;
        }
        else
#endif
        {
            pinnedObjectMap.Remove(obj);
        }

        RECYCLER_PERF_COUNTER_DEC(PinnedObject);
    }

    // Any time a root is removed during a GC, it indicates that an exhaustive
    // collection is likely going to have work to do so trigger an exhaustive
    // candidate GC to indicate this fact
    this->CollectNow<CollectExhaustiveCandidate>();
}